

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# futex_wrapper_linux.hpp
# Opt level: O2

void Fossilize::futex_wrapper_lock(int *lock)

{
  int iVar1;
  bool bVar2;
  
  LOCK();
  iVar1 = *lock;
  bVar2 = iVar1 == 0;
  if (bVar2) {
    *lock = 1;
    iVar1 = 0;
  }
  UNLOCK();
  do {
    if (bVar2) {
      return;
    }
    if (iVar1 == 2) {
LAB_001245af:
      syscall(0xca,lock,0,2,0,0,0);
    }
    else {
      LOCK();
      iVar1 = *lock;
      if (iVar1 == 1) {
        *lock = 2;
        iVar1 = 1;
      }
      UNLOCK();
      if (iVar1 != 0) goto LAB_001245af;
    }
    LOCK();
    iVar1 = *lock;
    bVar2 = iVar1 == 0;
    if (bVar2) {
      *lock = 2;
      iVar1 = 0;
    }
    UNLOCK();
  } while( true );
}

Assistant:

static inline void futex_wrapper_lock(int *lock)
{
	int c = cmpxchg(lock, 0, 1);
	if (c != 0)
	{
		// Contention.
		do
		{
			// Need to lock. Force *lock to be 2.
			if (c == 2 || cmpxchg(lock, 1, 2) != 0)
			{
				// If *lock is 2 (was not unlocked somehow by other thread),
				// wait until it's woken up.
				syscall(SYS_futex, lock, FUTEX_WAIT, 2, 0, 0, 0);
			}
		} while ((c = cmpxchg(lock, 0, 2)) != 0);
	}
}